

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall
CLParam<double>::CLParam(CLParam<double> *this,string *param_name,string *info,double default_val)

{
  string *__rhs;
  pointer pcVar1;
  long *plVar2;
  pointer pbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_name_split;
  undefined1 local_88 [24];
  long lStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_CLParam = (_func_int **)&PTR__CLParam_00113d40;
  __rhs = &this->parameter_name;
  (this->parameter_name)._M_dataplus._M_p = (pointer)&(this->parameter_name).field_2;
  pcVar1 = (param_name->_M_dataplus)._M_p;
  local_58 = default_val;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__rhs,pcVar1,pcVar1 + param_name->_M_string_length);
  this->parameter_name_short = '\0';
  local_60 = &(this->description).field_2;
  (this->description)._M_dataplus._M_p = (pointer)local_60;
  pcVar1 = (info->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + info->_M_string_length);
  this->value = local_58;
  this->default_value = local_58;
  this->is_set = false;
  if ((this->description)._M_string_length == 0) {
    std::operator+(&local_50,"No description for ",__rhs);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    pbVar3 = (pointer)(plVar2 + 2);
    if ((pointer)*plVar2 == pbVar3) {
      local_88._16_8_ = (pbVar3->_M_dataplus)._M_p;
      lStack_70 = plVar2[3];
      local_88._0_8_ = (pointer)(local_88 + 0x10);
    }
    else {
      local_88._16_8_ = (pbVar3->_M_dataplus)._M_p;
      local_88._0_8_ = (pointer)*plVar2;
    }
    local_88._8_8_ = plVar2[1];
    *plVar2 = (long)pbVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->description,(string *)local_88);
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  CLOptionsHelper::split
            (param_name,',',
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88);
  if (local_88._8_8_ - local_88._0_8_ == 0x40) {
    this->parameter_name_short = *((_Alloc_hider *)local_88._0_8_)->_M_p;
    std::__cxx11::string::_M_assign((string *)__rhs);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  return;
}

Assistant:

CLParam<T>(const std::string& param_name,
               const std::string& info,
               T default_val) :
        parameter_name(param_name), description(info),
        value(default_val), default_value(default_val),
        is_set(false)
    {
        if (description.empty()) description="No description for " + parameter_name + ". I guess you're on your own.";
        std::vector<std::string> param_name_split = CLOptionsHelper::split(param_name, ',') ;
        if (param_name_split.size() == 2) {
            parameter_name_short = param_name_split[0][0] ;
            parameter_name = param_name_split[1] ;
        }
    }